

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

bool FIX::Message::isAdminMsgType(MsgType *msgType)

{
  long lVar1;
  char *pcVar2;
  MsgType *msgType_local;
  
  StringField::getValue_abi_cxx11_(&msgType->super_StringField);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 1) {
    StringField::getValue_abi_cxx11_(&msgType->super_StringField);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strchr("0A12345",(int)*pcVar2);
    msgType_local._7_1_ = pcVar2 != (char *)0x0;
  }
  else {
    msgType_local._7_1_ = false;
  }
  return msgType_local._7_1_;
}

Assistant:

static bool isAdminMsgType( const MsgType& msgType )
  { if ( msgType.getValue().length() != 1 ) return false;
    return strchr
           ( "0A12345",
             msgType.getValue().c_str() [ 0 ] ) != 0;
  }